

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_constructors_initialiser_lists_Test::
test_matrix_dense_constructors_initialiser_lists_Test
          (test_matrix_dense_constructors_initialiser_lists_Test *this)

{
  test_matrix_dense_constructors_initialiser_lists_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__test_matrix_dense_constructors_initialiser_lists_Test_001ed8f0;
  return;
}

Assistant:

TEST(test_matrix_dense, constructors_initialiser_lists) {

  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1.0, 2.0}, {3.0, 4.0}};
  Matrix_Dense<Scalar, 2, 2> static_matrix = {{5.0, 6.0}, {7.0, 8.0}};

  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], 3.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], 4.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][0], 5.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][1], 6.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][0], 7.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][1], 8.0);
}